

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O0

int EncodeAlpha(VP8Encoder *enc,int quality,int method,int filter,int effort_level,uint8_t **output,
               size_t *output_size)

{
  WebPPicture *pic_00;
  void *pvVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined8 *in_stack_00000008;
  int alpha_levels;
  int reduce_levels;
  int ok;
  uint64_t sse;
  size_t data_size;
  uint8_t *quant_alpha;
  int height;
  int width;
  WebPPicture *pic;
  int in_stack_00000190;
  int in_stack_00000194;
  size_t in_stack_00000198;
  int in_stack_000001a0;
  int in_stack_000001a4;
  uint8_t *in_stack_000001a8;
  int in_stack_000001c0;
  int in_stack_000001c8;
  uint8_t **in_stack_000001d0;
  size_t *in_stack_000001d8;
  WebPAuxStats *in_stack_000001e0;
  uint64_t *in_stack_000020f0;
  int in_stack_000020fc;
  int in_stack_00002100;
  int in_stack_00002104;
  uint8_t *in_stack_00002108;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint64_t in_stack_ffffffffffffff78;
  uint8_t *in_stack_ffffffffffffff80;
  int local_64;
  int local_14;
  
  pic_00 = *(WebPPicture **)(in_RDI + 8);
  local_64 = 1;
  if ((in_ESI < 0) || (100 < in_ESI)) {
    local_14 = WebPEncodingSetError(pic_00,VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  else if ((in_EDX < 0) || (1 < in_EDX)) {
    local_14 = WebPEncodingSetError(pic_00,VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  else {
    pvVar1 = WebPSafeMalloc(in_stack_ffffffffffffff78,
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (pvVar1 == (void *)0x0) {
      local_14 = WebPEncodingSetError(pic_00,VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    else {
      WebPCopyPlane(in_stack_ffffffffffffff80,(int)(in_stack_ffffffffffffff78 >> 0x20),
                    (uint8_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
      if (in_ESI < 100) {
        local_64 = QuantizeLevels(in_stack_00002108,in_stack_00002104,in_stack_00002100,
                                  in_stack_000020fc,in_stack_000020f0);
      }
      if (local_64 != 0) {
        VP8FiltersInit();
        local_64 = ApplyFiltersAndEncode
                             (in_stack_000001a8,in_stack_000001a4,in_stack_000001a0,
                              in_stack_00000198,in_stack_00000194,in_stack_00000190,
                              in_stack_000001c0,in_stack_000001c8,in_stack_000001d0,
                              in_stack_000001d8,in_stack_000001e0);
        if (local_64 == 0) {
          WebPEncodingSetError(pic_00,VP8_ENC_ERROR_OUT_OF_MEMORY);
        }
        if (pic_00->stats != (WebPAuxStats *)0x0) {
          pic_00->stats->coded_size = (int)*in_stack_00000008 + pic_00->stats->coded_size;
          *(undefined8 *)(in_RDI + 0x5bf0) = 0;
        }
      }
      WebPSafeFree((void *)0x16ce54);
      local_14 = local_64;
    }
  }
  return local_14;
}

Assistant:

static int EncodeAlpha(VP8Encoder* const enc,
                       int quality, int method, int filter,
                       int effort_level,
                       uint8_t** const output, size_t* const output_size) {
  const WebPPicture* const pic = enc->pic;
  const int width = pic->width;
  const int height = pic->height;

  uint8_t* quant_alpha = NULL;
  const size_t data_size = width * height;
  uint64_t sse = 0;
  int ok = 1;
  const int reduce_levels = (quality < 100);

  // quick correctness checks
  assert((uint64_t)data_size == (uint64_t)width * height);  // as per spec
  assert(enc != NULL && pic != NULL && pic->a != NULL);
  assert(output != NULL && output_size != NULL);
  assert(width > 0 && height > 0);
  assert(pic->a_stride >= width);
  assert(filter >= WEBP_FILTER_NONE && filter <= WEBP_FILTER_FAST);

  if (quality < 0 || quality > 100) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }

  if (method < ALPHA_NO_COMPRESSION || method > ALPHA_LOSSLESS_COMPRESSION) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }

  if (method == ALPHA_NO_COMPRESSION) {
    // Don't filter, as filtering will make no impact on compressed size.
    filter = WEBP_FILTER_NONE;
  }

  quant_alpha = (uint8_t*)WebPSafeMalloc(1ULL, data_size);
  if (quant_alpha == NULL) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  // Extract alpha data (width x height) from raw_data (stride x height).
  WebPCopyPlane(pic->a, pic->a_stride, quant_alpha, width, width, height);

  if (reduce_levels) {  // No Quantization required for 'quality = 100'.
    // 16 alpha levels gives quite a low MSE w.r.t original alpha plane hence
    // mapped to moderate quality 70. Hence Quality:[0, 70] -> Levels:[2, 16]
    // and Quality:]70, 100] -> Levels:]16, 256].
    const int alpha_levels = (quality <= 70) ? (2 + quality / 5)
                                             : (16 + (quality - 70) * 8);
    ok = QuantizeLevels(quant_alpha, width, height, alpha_levels, &sse);
  }

  if (ok) {
    VP8FiltersInit();
    ok = ApplyFiltersAndEncode(quant_alpha, width, height, data_size, method,
                               filter, reduce_levels, effort_level, output,
                               output_size, pic->stats);
    if (!ok) {
      WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);  // imprecise
    }
#if !defined(WEBP_DISABLE_STATS)
    if (pic->stats != NULL) {  // need stats?
      pic->stats->coded_size += (int)(*output_size);
      enc->sse[3] = sse;
    }
#endif
  }

  WebPSafeFree(quant_alpha);
  return ok;
}